

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O3

void __thiscall BufferedFileWriter::thread_main(BufferedFileWriter *this)

{
  bool bVar1;
  WriterData writerData;
  WriterData local_50;
  
  if (this->m_terminated == false) {
    do {
      WaitableSafeQueue<WriterData>::pop(&local_50,&this->m_writeQueue);
      WriterData::execute(&local_50);
      bVar1 = SafeQueue<WriterData>::empty((SafeQueue<WriterData> *)&this->m_writeQueue);
      this->m_nothingToExecute = bVar1;
    } while (this->m_terminated == false);
  }
  return;
}

Assistant:

void BufferedFileWriter::thread_main()
{
    while (!m_terminated)
    {
        WriterData writerData = m_writeQueue.pop();
        try
        {
            writerData.execute();
        }
        catch (std::runtime_error& e)
        {
            m_lastErrorStr = e.what();
            m_lastErrorCode = -1;
            LTRACE(LT_ERROR, 0, "BufferedFileWriter::thread_main() throws runtime_error: " << e.what());
        }
        catch (std::exception& e)
        {
            m_lastErrorStr = e.what();
            m_lastErrorCode = -1;
            LTRACE(LT_ERROR, 0, "BufferedFileWriter::thread_main() throws exception: " << e.what());
        }
        catch (...)
        {
            m_lastErrorStr = "Unknown expcetion";
            m_lastErrorCode = -1;
            LTRACE(LT_ERROR, 0, "BufferedFileWriter::thread_main() throws unknown exception");
        }
        m_nothingToExecute = m_writeQueue.empty();
    }
}